

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

vector<float,_pstd::pmr::polymorphic_allocator<float>_> *
pbrt::Sample1DFunction
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
          function<float_(float)> *f,int nSteps,int nSamples,Float min,Float max,Allocator alloc)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 in_register_0000000c;
  size_t n;
  int iVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  float local_4c;
  undefined8 local_48;
  float **local_40;
  ulong local_38;
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var [56];
  
  n = (size_t)nSteps;
  auVar5._0_12_ = ZEXT812(0);
  auVar5._12_4_ = 0;
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  local_48 = CONCAT44(in_register_0000000c,nSamples);
  __return_storage_ptr__->nStored = 0;
  __return_storage_ptr__->ptr = (float *)auVar5._0_8_;
  __return_storage_ptr__->nAlloc = auVar5._8_8_;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(__return_storage_ptr__,n);
  if (nSteps == 0) {
    __return_storage_ptr__->nStored = n;
  }
  else {
    memset(__return_storage_ptr__->ptr,0,n * 4);
    __return_storage_ptr__->nStored = n;
    if (0 < nSteps) {
      uVar4 = 0;
      local_40 = &__return_storage_ptr__->ptr;
      iVar2 = (int)local_48;
      do {
        if ((int)local_48 < 0) {
          fVar6 = 0.0;
        }
        else {
          iVar3 = 0;
          auVar5 = ZEXT816(0);
          do {
            local_38 = auVar5._0_8_;
            fVar6 = ((float)iVar3 / (float)iVar2 + (float)(int)uVar4) / (float)nSteps;
            auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * max)),ZEXT416((uint)(1.0 - fVar6)),
                                     ZEXT416((uint)min));
            local_4c = auVar5._0_4_;
            if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            auVar8._0_4_ = (*f->_M_invoker)((_Any_data *)f,&local_4c);
            auVar8._4_4_ = extraout_XMM0_Db;
            auVar8._8_56_ = extraout_var;
            auVar1._8_4_ = 0x7fffffff;
            auVar1._0_8_ = 0x7fffffff7fffffff;
            auVar1._12_4_ = 0x7fffffff;
            auVar5 = vandps_avx512vl(auVar8._0_16_,auVar1);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = local_38;
            iVar3 = iVar3 + 1;
            auVar7._0_8_ = (double)auVar5._0_4_;
            auVar7._8_8_ = auVar5._8_8_;
            auVar5 = vmaxsd_avx(auVar7,auVar9);
          } while (iVar2 + 1 != iVar3);
          fVar6 = (float)auVar5._0_8_;
        }
        (*local_40)[uVar4] = fVar6;
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)nSteps);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<Float> Sample1DFunction(std::function<Float(Float)> f, int nSteps,
                                     int nSamples, Float min, Float max,
                                     Allocator alloc) {
    pstd::vector<Float> values(nSteps, Float(0), alloc);
    for (int i = 0; i < nSteps; ++i) {
        double accum = 0;
        // One extra so that we sample at the very start and the very end.
        for (int j = 0; j < nSamples + 1; ++j) {
            Float delta = Float(j) / nSamples;
            Float v = Lerp((i + delta) / Float(nSteps), min, max);
            Float fv = std::abs(f(v));
            accum = std::max<double>(accum, fv);
        }
        // There's actually no need for the divide by nSamples, since
        // these are normalzed into a PDF anyway.
        values[i] = accum;
    }
    return values;
}